

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

StatusOr<unsigned_long>
google::protobuf::json_internal::anon_unknown_5::
ParseUInt<google::protobuf::json_internal::ParseProto2Descriptor>
          (JsonLexer *lex,Field<google::protobuf::json_internal::ParseProto2Descriptor> field)

{
  long in_RDX;
  anon_union_8_2_a3c22f61_for_StatusOrData<unsigned_long>_3 extraout_RDX;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  StatusOr<unsigned_long> SVar1;
  Status _status;
  StatusOr<google::protobuf::json_internal::LocationWith<unsigned_long>_> n;
  
  ParseIntInner<unsigned_long>(&n,(JsonLexer *)field,in_XMM0_Qa,in_XMM1_Qa);
  absl::lts_20240722::Status::Status(&_status,(Status *)&n);
  if (_status.rep_ == 1) {
    absl::lts_20240722::Status::~Status(&_status);
    if ((*(uint *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(byte *)(in_RDX + 2) * 4) < 9) &&
       ((0x14aU >> (*(uint *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(byte *)(in_RDX + 2) * 4)
                   & 0x1f) & 1) != 0)) {
      absl::lts_20240722::internal_statusor::
      StatusOrData<google::protobuf::json_internal::LocationWith<unsigned_long>_>::EnsureOk
                (&n.
                  super_StatusOrData<google::protobuf::json_internal::LocationWith<unsigned_long>_>)
      ;
      if (n.super_StatusOrData<google::protobuf::json_internal::LocationWith<unsigned_long>_>.
          field_1.data_.value._4_4_ != 0) {
        absl::lts_20240722::internal_statusor::
        StatusOrData<google::protobuf::json_internal::LocationWith<unsigned_long>_>::EnsureOk
                  (&n.
                    super_StatusOrData<google::protobuf::json_internal::LocationWith<unsigned_long>_>
                  );
        JsonLocation::Invalid
                  ((JsonLocation *)&_status,
                   (undefined1 *)
                   ((long)&n.
                           super_StatusOrData<google::protobuf::json_internal::LocationWith<unsigned_long>_>
                           .field_1 + 8),0x14,"integer out of range");
        absl::lts_20240722::internal_statusor::StatusOrData<unsigned_long>::
        StatusOrData<absl::lts_20240722::Status,_0>((StatusOrData<unsigned_long> *)lex,&_status);
        goto LAB_0029352f;
      }
    }
    absl::lts_20240722::internal_statusor::
    StatusOrData<google::protobuf::json_internal::LocationWith<unsigned_long>_>::EnsureOk
              (&n.super_StatusOrData<google::protobuf::json_internal::LocationWith<unsigned_long>_>)
    ;
    (lex->stream_).last_chunk_._M_len =
         CONCAT44(n.
                  super_StatusOrData<google::protobuf::json_internal::LocationWith<unsigned_long>_>.
                  field_1.data_.value._4_4_,
                  n.
                  super_StatusOrData<google::protobuf::json_internal::LocationWith<unsigned_long>_>.
                  field_1.data_.value._0_4_);
    (lex->stream_).stream_ = (ZeroCopyInputStream *)0x1;
  }
  else {
    absl::lts_20240722::internal_statusor::StatusOrData<unsigned_long>::
    StatusOrData<const_absl::lts_20240722::Status,_0>((StatusOrData<unsigned_long> *)lex,&_status);
LAB_0029352f:
    absl::lts_20240722::Status::~Status(&_status);
  }
  absl::lts_20240722::Status::~Status((Status *)&n);
  SVar1.super_StatusOrData<unsigned_long>.field_1.data_ = extraout_RDX.data_;
  SVar1.super_StatusOrData<unsigned_long>.field_0 =
       (anon_union_8_1_1246618d_for_StatusOrData<unsigned_long>_1)lex;
  return (StatusOr<unsigned_long>)SVar1.super_StatusOrData<unsigned_long>;
}

Assistant:

absl::StatusOr<uint64_t> ParseUInt(JsonLexer& lex, Field<Traits> field) {
  absl::StatusOr<LocationWith<uint64_t>> n =
      ParseIntInner<uint64_t>(lex, 0, 18014398509481984.0);
  RETURN_IF_ERROR(n.status());

  if (Traits::Is32Bit(field)) {
    if (n->value > std::numeric_limits<uint32_t>::max()) {
      return n->loc.Invalid("integer out of range");
    }
  }

  return n->value;
}